

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

X509_POLICY_LEVEL * x509_policy_level_new(void)

{
  stack_st_X509_POLICY_NODE *psVar1;
  X509_POLICY_LEVEL *level;
  
  level = (X509_POLICY_LEVEL *)OPENSSL_zalloc(0x10);
  if (level == (X509_POLICY_LEVEL *)0x0) {
    level = (X509_POLICY_LEVEL *)0x0;
  }
  else {
    psVar1 = sk_X509_POLICY_NODE_new(x509_policy_node_cmp);
    level->nodes = psVar1;
    if (level->nodes == (stack_st_X509_POLICY_NODE *)0x0) {
      x509_policy_level_free(level);
      level = (X509_POLICY_LEVEL *)0x0;
    }
  }
  return level;
}

Assistant:

static X509_POLICY_LEVEL *x509_policy_level_new(void) {
  X509_POLICY_LEVEL *level = reinterpret_cast<X509_POLICY_LEVEL *>(
      OPENSSL_zalloc(sizeof(X509_POLICY_LEVEL)));
  if (level == NULL) {
    return NULL;
  }
  level->nodes = sk_X509_POLICY_NODE_new(x509_policy_node_cmp);
  if (level->nodes == NULL) {
    x509_policy_level_free(level);
    return NULL;
  }
  return level;
}